

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::SIMDFastPFor<8U>::__decodeArray
          (SIMDFastPFor<8U> *this,uint32_t *in,size_t *length,uint32_t *out,size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  pointer pvVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint32_t run;
  long lVar9;
  ulong uVar10;
  uint32_t *puVar11;
  bool bVar12;
  uint *apuStack_930 [255];
  const_iterator unpackpointers [33];
  
  puVar11 = in + (ulong)*in + 1;
  puVar4 = (uint32_t *)
           ((long)in + ((ulong)puVar11[-1] + 3 & 0xfffffffffffffffc) + 8 + (ulong)*in * 4);
  uVar7 = puVar4[-1];
  uVar8 = 1;
  for (lVar9 = 0x30; lVar9 != 0x318; lVar9 = lVar9 + 0x18) {
    if ((uVar7 >> (uVar8 & 0x1f) & 1) != 0) {
      puVar4 = SIMDFastPFor<8u>::
               unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                         (puVar4,(vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                  *)((long)&(((this->datatobepacked).
                                              super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                            )._M_impl.super__Vector_impl_data + lVar9),uVar8 + 1);
    }
    uVar8 = uVar8 + 1;
  }
  *length = (long)puVar4 - (long)in >> 2;
  unpackpointers[0x18]._M_current = (uint *)0x0;
  unpackpointers[0x19]._M_current = (uint *)0x0;
  unpackpointers[0x1a]._M_current = (uint *)0x0;
  unpackpointers[0x1b]._M_current = (uint *)0x0;
  unpackpointers[0x1c]._M_current = (uint *)0x0;
  unpackpointers[0x1d]._M_current = (uint *)0x0;
  unpackpointers[0x1e]._M_current = (uint *)0x0;
  unpackpointers[0x1f]._M_current = (uint *)0x0;
  unpackpointers[0x10]._M_current = (uint *)0x0;
  unpackpointers[0x11]._M_current = (uint *)0x0;
  unpackpointers[0x12]._M_current = (uint *)0x0;
  unpackpointers[0x13]._M_current = (uint *)0x0;
  unpackpointers[0x14]._M_current = (uint *)0x0;
  unpackpointers[0x15]._M_current = (uint *)0x0;
  unpackpointers[0x16]._M_current = (uint *)0x0;
  unpackpointers[0x17]._M_current = (uint *)0x0;
  unpackpointers[8]._M_current = (uint *)0x0;
  unpackpointers[9]._M_current = (uint *)0x0;
  unpackpointers[10]._M_current = (uint *)0x0;
  unpackpointers[0xb]._M_current = (uint *)0x0;
  unpackpointers[0xc]._M_current = (uint *)0x0;
  unpackpointers[0xd]._M_current = (uint *)0x0;
  unpackpointers[0xe]._M_current = (uint *)0x0;
  unpackpointers[0xf]._M_current = (uint *)0x0;
  unpackpointers[0]._M_current = (uint *)0x0;
  unpackpointers[1]._M_current = (uint *)0x0;
  unpackpointers[2]._M_current = (uint *)0x0;
  unpackpointers[3]._M_current = (uint *)0x0;
  unpackpointers[4]._M_current = (uint *)0x0;
  unpackpointers[5]._M_current = (uint *)0x0;
  unpackpointers[6]._M_current = (uint *)0x0;
  unpackpointers[7]._M_current = (uint *)0x0;
  unpackpointers[0x20]._M_current = (uint *)0x0;
  pvVar5 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar9 = 1; pvVar5 = pvVar5 + 1, lVar9 != 0x21; lVar9 = lVar9 + 1) {
    unpackpointers[lVar9]._M_current =
         (pvVar5->
         super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>).
         _M_impl.super__Vector_impl_data._M_start;
  }
  puVar4 = in + 1;
  for (uVar10 = 0; uVar10 < nvalue >> 8; uVar10 = (ulong)((int)uVar10 + 1)) {
    uVar3 = *puVar11;
    uVar8 = (uint)(byte)uVar3;
    bVar2 = *(byte *)((long)puVar11 + 1);
    uVar7 = (uint)bVar2;
    puVar4 = unpackblocksimd(puVar4,out,uVar8);
    if (bVar2 == 0) {
      puVar11 = (uint32_t *)((long)puVar11 + 2);
    }
    else {
      pbVar1 = (byte *)((long)puVar11 + 2);
      puVar11 = (uint32_t *)((long)puVar11 + 3);
      lVar9 = (ulong)*pbVar1 - (ulong)(byte)uVar3;
      if ((int)lVar9 == 1) {
        while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
          uVar3 = *puVar11;
          puVar11 = (uint32_t *)((long)puVar11 + 1);
          out[(byte)uVar3] = out[(byte)uVar3] | 1 << (uVar8 & 0x1f);
        }
      }
      else {
        puVar6 = unpackpointers[lVar9]._M_current;
        while( true ) {
          bVar12 = uVar7 == 0;
          uVar7 = uVar7 - 1;
          if (bVar12) break;
          uVar3 = *puVar11;
          unpackpointers[lVar9]._M_current = puVar6 + 1;
          puVar11 = (uint32_t *)((long)puVar11 + 1);
          out[(byte)uVar3] = out[(byte)uVar3] | *puVar6 << (uVar8 & 0x1f);
          puVar6 = puVar6 + 1;
        }
      }
    }
    out = out + 0x100;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    const uint32_t bitmap = *(inexcept++);
    for (uint32_t k = 2; k <= 32; ++k) {
      if ((bitmap & (1U << (k - 1))) != 0) {
        inexcept = unpackmesimd(inexcept, datatobepacked[k], k);
      }
    }
    length = inexcept - initin;
    std::vector<uint32_t, cacheallocator>::const_iterator
        unpackpointers[32 + 1];
    for (uint32_t k = 1; k <= 32; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblocksimd(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint32_t>(1) << b;
          }
        } else {
          std::vector<uint32_t, cacheallocator>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (*(exceptionsptr++)) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }